

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O1

tmbstr prvTidytidyNormalizedLocaleName(ctmbstr locale)

{
  int iVar1;
  tmbstr ptVar2;
  size_t sVar3;
  __int32_t **pp_Var4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  tidyLocaleMapItemImpl *ptVar8;
  
  ptVar2 = prvTidytmbstrdup(&prvTidyg_default_allocator,locale);
  ptVar2 = prvTidytmbstrtolower(ptVar2);
  iVar1 = strcmp("america",ptVar2);
  if (iVar1 == 0) {
    ptVar8 = localeMappings;
  }
  else {
    uVar7 = 1;
    do {
      uVar5 = uVar7;
      if (localeMappings[uVar5].winName == (char *)0x0) goto LAB_0015b2b3;
      iVar1 = strcmp(localeMappings[uVar5].winName,ptVar2);
      uVar7 = uVar5 + 1;
    } while (iVar1 != 0);
    ptVar8 = localeMappings + uVar5;
  }
  (*(prvTidyg_default_allocator.vtbl)->free)(&prvTidyg_default_allocator,ptVar2);
  ptVar2 = prvTidytmbstrdup(&prvTidyg_default_allocator,ptVar8->POSIXName);
LAB_0015b2b3:
  sVar3 = strlen(ptVar2);
  uVar7 = (uint)sVar3;
  if (uVar7 != 0) {
    uVar5 = 5;
    if (uVar7 < 5) {
      uVar5 = uVar7;
    }
    uVar6 = 0;
    do {
      if (uVar6 == 2) {
        if (uVar7 < 5) {
          prvTidytidyNormalizedLocaleName::result[2] = '\0';
          break;
        }
        prvTidytidyNormalizedLocaleName::result[2] = '_';
      }
      else {
        pp_Var4 = __ctype_tolower_loc();
        prvTidytidyNormalizedLocaleName::result[uVar6] = (char)(*pp_Var4)[ptVar2[uVar6]];
      }
      uVar6 = uVar6 + 1;
    } while (uVar5 + (uVar5 == 0) != uVar6);
  }
  (*(prvTidyg_default_allocator.vtbl)->free)(&prvTidyg_default_allocator,ptVar2);
  return prvTidytidyNormalizedLocaleName::result;
}

Assistant:

tmbstr TY_(tidyNormalizedLocaleName)( ctmbstr locale )
{
    uint i;
    uint len;
    static char result[6] = "xx_yy";
    TidyAllocator * allocator = &TY_(g_default_allocator);

    tmbstr search = TY_(tmbstrdup)( allocator, locale );
    search = TY_(tmbstrtolower)(search);
    
    /* See if our string matches a Windows name. */
    for (i = 0; localeMappings[i].winName; ++i)
    {
        if ( strcmp( localeMappings[i].winName, search ) == 0 )
        {
            TidyFree( allocator, search );
            search = TY_(tmbstrdup)( allocator, localeMappings[i].POSIXName );
            break;
        }
    }
    
    /* We're going to be stupid about this and trust the user, and
     return just the first two characters if they exist and the
     4th and 5th if they exist. The worst that can happen is a
     junk language that doesn't exist and won't be set. */
    
    len = strlen( search );
    len = ( len <= 5 ? len : 5 );
    
    for ( i = 0; i < len; i++ )
    {
        if ( i == 2 )
        {
            /* Either terminate the string or ensure there's an underscore */
            if (len == 5) {
                result[i] = '_';
            }
            else {
                result[i] = '\0';
                break;      /* no need to copy after null */
            }
        }
        else
        {
            result[i] = tolower( search[i] );
        }
    }
    
    TidyFree( allocator, search );
    return result;
}